

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>_>::
int_writer<long_long,_fmt::v6::basic_format_specs<wchar_t>_>::on_num
          (int_writer<long_long,_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  char *pcVar1;
  char cVar2;
  format_specs *pfVar3;
  long lVar4;
  num_writer f;
  wchar_t wVar5;
  int iVar6;
  int iVar7;
  _Alloc_hider _Var8;
  uint uVar9;
  int iVar10;
  string_view prefix;
  string groups;
  string local_78;
  ulong local_58;
  int iStack_50;
  undefined4 uStack_4c;
  string *local_48;
  wchar_t wStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  grouping_impl<wchar_t>(&local_78,(locale_ref)(this->writer->locale_).locale_);
  if (local_78._M_string_length == 0) {
    on_dec(this);
    goto LAB_00177003;
  }
  wVar5 = thousands_sep_impl<wchar_t>((locale_ref)(this->writer->locale_).locale_);
  if (wVar5 == L'\0') {
    on_dec(this);
    goto LAB_00177003;
  }
  local_58 = this->abs_value;
  lVar4 = 0x3f;
  if ((local_58 | 1) != 0) {
    for (; (local_58 | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
    }
  }
  uVar9 = ((uint)lVar4 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  iVar10 = (uVar9 + 1) -
           (uint)(local_58 <
                 *(ulong *)(basic_data<void>::zero_or_powers_of_10_64 + (ulong)uVar9 * 8));
  pcVar1 = local_78._M_dataplus._M_p + local_78._M_string_length;
  _Var8._M_p = local_78._M_dataplus._M_p;
  iVar6 = iVar10;
  if (local_78._M_string_length == 0) {
LAB_00176f82:
    iVar7 = iVar6;
    iStack_50 = iVar10;
    if (_Var8._M_p == pcVar1) goto LAB_00176f8c;
  }
  else {
    iStack_50 = iVar10 + (int)local_78._M_string_length;
    do {
      cVar2 = *_Var8._M_p;
      iVar7 = iVar6 - cVar2;
      if ((iVar7 == 0 || iVar6 < cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) goto LAB_00176f82;
      iVar10 = iVar10 + 1;
      _Var8._M_p = _Var8._M_p + 1;
      local_78._M_string_length = local_78._M_string_length - 1;
      iVar6 = iVar7;
    } while (local_78._M_string_length != 0);
LAB_00176f8c:
    iStack_50 = (iVar7 + -1) / (int)pcVar1[-1] + iStack_50;
  }
  pfVar3 = this->specs;
  local_38._0_4_ = pfVar3->width;
  local_38._4_4_ = pfVar3->precision;
  uStack_30._0_1_ = pfVar3->type;
  uStack_30._1_3_ = *(undefined3 *)&pfVar3->field_0x9;
  uStack_30._4_4_ = (pfVar3->fill).data_[0];
  local_28 = *(undefined8 *)((pfVar3->fill).data_ + 1);
  uStack_20 = *(undefined8 *)((pfVar3->fill).data_ + 3);
  f._12_4_ = uStack_4c;
  f.size = iStack_50;
  f._28_4_ = uStack_3c;
  f.sep = wVar5;
  f.abs_value = local_58;
  f.groups = &local_78;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  local_48 = &local_78;
  wStack_40 = wVar5;
  basic_writer<fmt::v6::buffer_range<wchar_t>>::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<long_long,fmt::v6::basic_format_specs<wchar_t>>::num_writer>
            ((basic_writer<fmt::v6::buffer_range<wchar_t>> *)this->writer,iStack_50,prefix,*pfVar3,f
            );
LAB_00177003:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = thousands_sep<char_type>(writer.locale_);
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, sep});
    }